

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O2

llama_ubatch * __thiscall
llama_sbatch::split_equal(llama_ubatch *__return_storage_ptr__,llama_sbatch *this,size_t n_ubatch)

{
  pointer plVar1;
  pointer plVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  size_t length;
  llama_sbatch_seq *seq;
  long lVar8;
  
  if (this->n_tokens < n_ubatch) {
    n_ubatch = this->n_tokens;
  }
  reserve_ubatch(__return_storage_ptr__,this,n_ubatch,this->batch->embd != (float *)0x0);
  plVar1 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar2 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (plVar1 != plVar2) {
    if (plVar1->n_seq_id < 1) {
      pcVar4 = "seq[0].n_seq_id > 0";
      uVar7 = 0x9f;
LAB_001cbb97:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
                 ,uVar7,"GGML_ASSERT(%s) failed",pcVar4);
    }
    lVar6 = (long)plVar2 - (long)plVar1;
    lVar5 = (lVar6 >> 5) + 1;
    length = 0;
    lVar8 = 0;
    while( true ) {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) break;
      plVar1 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)&plVar1[-1].length + lVar6);
      if (uVar3 == 0) {
        pcVar4 = "s.length > 0";
        uVar7 = 0xa4;
        goto LAB_001cbb97;
      }
      seq = (llama_sbatch_seq *)((long)&plVar1[-1].n_seq_id + lVar6);
      if (n_ubatch <= uVar3) {
        uVar3 = n_ubatch;
      }
      if (length == 0) {
        length = uVar3;
      }
      add_seq_to_ubatch(this,__return_storage_ptr__,seq,length);
      if (1 < seq->n_seq_id) {
        return __return_storage_ptr__;
      }
      lVar8 = lVar8 + length;
      lVar6 = lVar6 + -0x20;
      if (n_ubatch < lVar8 + length) {
        return __return_storage_ptr__;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

llama_ubatch llama_sbatch::split_equal(size_t n_ubatch) {
    n_ubatch = n_tokens < n_ubatch ? n_tokens : n_ubatch;
    llama_ubatch ubatch = reserve_ubatch(n_ubatch, /* has_embd */ batch->embd != nullptr);
    if (!seq.empty()) {
        size_t length = 0;
        size_t n_tokens_in_ubatch = 0;
        GGML_ASSERT(seq[0].n_seq_id > 0); // should not be mixed with simple splits
                                          // smallest first, because it's easier to split this way;
                                          // starting from the end to pop in constant time.
        for (size_t i = seq.size(); i-- > 0;) {
            llama_sbatch_seq & s = seq[i];
            GGML_ASSERT(s.length > 0);
            if (length == 0) {
                length = s.length < n_ubatch ? s.length : n_ubatch;
            }
            add_seq_to_ubatch(ubatch, s, length);
            n_tokens_in_ubatch += length;
            // shared prompts can't be mixed with any of their sequences,
            // so it's safer to compute them in their own ubatch
            if (s.n_seq_id > 1) { break; }
            // stop when there isn't enough space for another sequence
            if (length + n_tokens_in_ubatch > n_ubatch) { break; }
        }
    }
    return ubatch;
}